

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Cluster * __thiscall mkvparser::Segment::GetNext(Segment *this,Cluster *pCurr)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  long lVar5;
  longlong lVar6;
  longlong *pos_00;
  long *len_00;
  Segment *pSegment;
  Cluster *pCVar7;
  long in_RSI;
  long in_RDI;
  ptrdiff_t idx_next;
  Cluster *pNext;
  Cluster *pNext_2;
  Cluster **k;
  Cluster **j;
  Cluster **jj;
  Cluster **i;
  Cluster **ii;
  long status;
  long len_;
  longlong pos_;
  longlong off_next_;
  longlong size_1;
  longlong id_1;
  longlong idpos;
  longlong result_1;
  long len_1;
  longlong off_next;
  longlong size;
  longlong id;
  longlong result;
  long len;
  longlong stop;
  longlong pos;
  Cluster *pNext_1;
  long idx;
  long *in_stack_ffffffffffffff08;
  IMkvReader *in_stack_ffffffffffffff18;
  longlong in_stack_ffffffffffffff20;
  IMkvReader *in_stack_ffffffffffffff28;
  Segment *in_stack_ffffffffffffff30;
  IMkvReader *in_stack_ffffffffffffff38;
  Segment *pSVar8;
  Segment *idx_00;
  long in_stack_ffffffffffffff58;
  Cluster *in_stack_ffffffffffffff60;
  Segment *in_stack_ffffffffffffff68;
  long local_68;
  long *local_60;
  long local_40;
  Segment *local_30;
  Segment *local_8;
  
  if (*(long *)(in_RSI + 0x10) < 0) {
    lVar5 = *(long *)(in_RSI + 8);
    lVar1 = *(long *)(in_RDI + 0x10);
    lVar2 = *(long *)(in_RDI + 0x18);
    lVar6 = GetUIntLength(in_stack_ffffffffffffff18,in_RDI,in_stack_ffffffffffffff08);
    if (lVar6 == 0) {
      lVar6 = ReadID(in_stack_ffffffffffffff38,(longlong)in_stack_ffffffffffffff30,
                     (long *)in_stack_ffffffffffffff28);
      if (lVar6 == 0x1f43b675) {
        GetUIntLength(in_stack_ffffffffffffff18,in_RDI,in_stack_ffffffffffffff08);
        lVar6 = ReadUInt(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                         (long *)in_stack_ffffffffffffff18);
        local_30 = (Segment *)(lVar6 + local_40 * 2 + lVar5);
        local_60 = (long *)0x0;
        while (len_00 = local_60, (long)local_30 < lVar1 + lVar2) {
          lVar6 = GetUIntLength(in_stack_ffffffffffffff18,in_RDI,in_stack_ffffffffffffff08);
          if (lVar6 != 0) {
            return (Cluster *)0x0;
          }
          pSVar8 = local_30;
          lVar6 = ReadID(in_stack_ffffffffffffff38,(longlong)in_stack_ffffffffffffff30,
                         (long *)in_stack_ffffffffffffff28);
          if (lVar6 < 0) {
            return (Cluster *)0x0;
          }
          local_30 = (Segment *)((long)&local_30->m_pReader + local_68 * 2);
          GetUIntLength(in_stack_ffffffffffffff18,in_RDI,in_stack_ffffffffffffff08);
          pos_00 = (longlong *)
                   ReadUInt(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            (long *)in_stack_ffffffffffffff18);
          if (pos_00 != (longlong *)0x0) {
            if (lVar6 == 0x1f43b675) {
              len_00 = (long *)((long)pSVar8 - *(long *)(in_RDI + 0x10));
              in_stack_ffffffffffffff58 = Cluster::HasBlockEntries(pSVar8,0x1f43b675,pos_00,len_00);
              if (0 < in_stack_ffffffffffffff58) break;
            }
            local_30 = (Segment *)((long)pos_00 + (long)local_30);
          }
        }
        local_60 = len_00;
        if ((long)local_60 < 1) {
          local_8 = (Segment *)0x0;
        }
        else {
          pSegment = (Segment *)(*(long *)(in_RDI + 0xa8) + *(long *)(in_RDI + 0xb0) * 8);
          idx_00 = (Segment *)(&pSegment->m_pReader + *(long *)(in_RDI + 0xb8));
          pSVar8 = idx_00;
          do {
            while( true ) {
              if (pSVar8 <= pSegment) {
                pCVar7 = Cluster::Create(pSegment,(long)idx_00,(longlong)pSVar8);
                if (pCVar7 == (Cluster *)0x0) {
                  return (Cluster *)0x0;
                }
                bVar4 = PreloadCluster(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                       in_stack_ffffffffffffff58);
                if (bVar4) {
                  return pCVar7;
                }
                if (pCVar7 != (Cluster *)0x0) {
                  Cluster::~Cluster((Cluster *)in_stack_ffffffffffffff30);
                  operator_delete(pCVar7);
                }
                return (Cluster *)0x0;
              }
              auVar3._8_8_ = (long)pSVar8 - (long)pSegment >> 0x3f;
              auVar3._0_8_ = (long)pSVar8 - (long)pSegment >> 3;
              in_stack_ffffffffffffff30 =
                   (Segment *)(&pSegment->m_pReader + SUB168(auVar3 / SEXT816(2),0));
              local_8 = (Segment *)in_stack_ffffffffffffff30->m_pReader;
              lVar6 = Cluster::GetPosition((Cluster *)local_8);
              if ((long)local_60 <= lVar6) break;
              pSegment = (Segment *)&in_stack_ffffffffffffff30->m_element_start;
            }
            pSVar8 = in_stack_ffffffffffffff30;
          } while ((long)local_60 < lVar6);
        }
      }
      else {
        local_8 = (Segment *)0x0;
      }
    }
    else {
      local_8 = (Segment *)0x0;
    }
  }
  else {
    lVar5 = *(long *)(in_RSI + 0x10) + 1;
    if (lVar5 < *(long *)(in_RDI + 0xb0)) {
      local_8 = *(Segment **)(*(long *)(in_RDI + 0xa8) + lVar5 * 8);
    }
    else {
      local_8 = (Segment *)(in_RDI + 0x20);
    }
  }
  return (Cluster *)local_8;
}

Assistant:

const Cluster* Segment::GetNext(const Cluster* pCurr) {
  assert(pCurr);
  assert(pCurr != &m_eos);
  assert(m_clusters);

  long idx = pCurr->m_index;

  if (idx >= 0) {
    assert(m_clusterCount > 0);
    assert(idx < m_clusterCount);
    assert(pCurr == m_clusters[idx]);

    ++idx;

    if (idx >= m_clusterCount)
      return &m_eos;  // caller will LoadCluster as desired

    Cluster* const pNext = m_clusters[idx];
    assert(pNext);
    assert(pNext->m_index >= 0);
    assert(pNext->m_index == idx);

    return pNext;
  }

  assert(m_clusterPreloadCount > 0);

  long long pos = pCurr->m_element_start;

  assert(m_size >= 0);  // TODO
  const long long stop = m_start + m_size;  // end of segment

  {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long id = ReadID(m_pReader, pos, len);
    if (id != libwebm::kMkvCluster)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size > 0);  // TODO
    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    pos += size;  // consume payload
  }

  long long off_next = 0;

  while (pos < stop) {
    long len;

    long long result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);
    assert((pos + len) <= stop);  // TODO
    if (result != 0)
      return NULL;

    const long long idpos = pos;  // pos of next (potential) cluster

    const long long id = ReadID(m_pReader, idpos, len);
    if (id < 0)
      return NULL;

    pos += len;  // consume ID

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);
    assert(result == 0);  // TODO
    assert((pos + len) <= stop);  // TODO

    const long long size = ReadUInt(m_pReader, pos, len);
    assert(size >= 0);  // TODO

    pos += len;  // consume length of size of element
    assert((pos + size) <= stop);  // TODO

    // Pos now points to start of payload

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvCluster) {
      const long long off_next_ = idpos - m_start;

      long long pos_;
      long len_;

      const long status = Cluster::HasBlockEntries(this, off_next_, pos_, len_);

      assert(status >= 0);

      if (status > 0) {
        off_next = off_next_;
        break;
      }
    }

    pos += size;  // consume payload
  }

  if (off_next <= 0)
    return 0;

  Cluster** const ii = m_clusters + m_clusterCount;
  Cluster** i = ii;

  Cluster** const jj = ii + m_clusterPreloadCount;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[0, i) < pos_next
    //[i, j) ?
    //[j, jj)  > pos_next

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pNext = *k;
    assert(pNext);
    assert(pNext->m_index < 0);

    // const long long pos_ = pNext->m_pos;
    // assert(pos_);
    // pos = pos_ * ((pos_ < 0) ? -1 : 1);

    pos = pNext->GetPosition();

    if (pos < off_next)
      i = k + 1;
    else if (pos > off_next)
      j = k;
    else
      return pNext;
  }

  assert(i == j);

  Cluster* const pNext = Cluster::Create(this, -1, off_next);
  if (pNext == NULL)
    return NULL;

  const ptrdiff_t idx_next = i - m_clusters;  // insertion position

  if (!PreloadCluster(pNext, idx_next)) {
    delete pNext;
    return NULL;
  }
  assert(m_clusters);
  assert(idx_next < m_clusterSize);
  assert(m_clusters[idx_next] == pNext);

  return pNext;
}